

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

bool __thiscall duckdb_shell::ShellState::ReadFromFile(ShellState *this,string *file)

{
  undefined4 uVar1;
  undefined8 uVar2;
  int iVar3;
  char *__filename;
  FILE *pFVar4;
  undefined8 uVar5;
  long in_RDI;
  int rc;
  int savedLineno;
  FILE *inSaved;
  char *in_stack_00000060;
  int local_28;
  
  if (safe_mode) {
    fprintf(_stderr,".read cannot be used in -safe mode\n");
    return false;
  }
  uVar2 = *(undefined8 *)(in_RDI + 0x18);
  uVar1 = *(undefined4 *)(in_RDI + 0x10);
  std::__cxx11::string::c_str();
  iVar3 = notNormalFile(in_stack_00000060);
  if (iVar3 == 0) {
    __filename = (char *)std::__cxx11::string::c_str();
    pFVar4 = fopen64(__filename,"rb");
    *(FILE **)(in_RDI + 0x18) = pFVar4;
    if (pFVar4 != (FILE *)0x0) {
      local_28 = ProcessInput((ShellState *)file);
      fclose(*(FILE **)(in_RDI + 0x18));
      goto LAB_001e072c;
    }
  }
  pFVar4 = _stderr;
  uVar5 = std::__cxx11::string::c_str();
  fprintf(pFVar4,"Error: cannot open \"%s\"\n",uVar5);
  local_28 = 1;
LAB_001e072c:
  *(undefined8 *)(in_RDI + 0x18) = uVar2;
  *(undefined4 *)(in_RDI + 0x10) = uVar1;
  return local_28 == 0;
}

Assistant:

bool ShellState::ReadFromFile(const string &file) {
	if (safe_mode) {
		utf8_printf(stderr, ".read cannot be used in -safe mode\n");
		return false;
	}
	FILE *inSaved = in;
	int savedLineno = lineno;
	int rc;
	if (notNormalFile(file.c_str()) || (in = fopen(file.c_str(), "rb")) == 0) {
		utf8_printf(stderr, "Error: cannot open \"%s\"\n", file.c_str());
		rc = 1;
	} else {
		rc = ProcessInput();
		fclose(in);
	}
	in = inSaved;
	lineno = savedLineno;
	return rc == 0;
}